

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.h
# Opt level: O1

void __thiscall
TPZSkylMatrix<std::complex<long_double>_>::~TPZSkylMatrix
          (TPZSkylMatrix<std::complex<long_double>_> *this)

{
  ~TPZSkylMatrix(this,&TPZSkylMatrix<std::complex<long_double>>::VTT);
  operator_delete(this,0x60);
  return;
}

Assistant:

virtual ~TPZSkylMatrix() { Clear(); }